

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::DecimalQuantity::getLowerDisplayMagnitude(DecimalQuantity *this)

{
  int local_28;
  int local_24;
  int32_t result;
  int32_t magnitude;
  DecimalQuantity *this_local;
  
  local_28 = this->scale;
  if (this->rReqPos < local_28) {
    local_24 = this->rReqPos;
  }
  else {
    if (local_28 < this->rOptPos) {
      local_28 = this->rOptPos;
    }
    local_24 = local_28;
  }
  return local_24;
}

Assistant:

int32_t DecimalQuantity::getLowerDisplayMagnitude() const {
    // If this assertion fails, you need to call roundToInfinity() or some other rounding method.
    // See the comment in the header file explaining the "isApproximate" field.
    U_ASSERT(!isApproximate);

    int32_t magnitude = scale;
    int32_t result = (rReqPos < magnitude) ? rReqPos : (rOptPos > magnitude) ? rOptPos : magnitude;
    return result;
}